

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O1

void addDataToBuffer(OutputBuffer *buf,size_t size)

{
  string data;
  string local_30;
  
  makeString_abi_cxx11_(&local_30,size);
  avro::detail::BufferImpl::writeTo
            ((buf->pimpl_).px,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void addDataToBuffer(OutputBuffer &buf, size_t size)
{
    std::string data = makeString(size);
    buf.writeTo(data.c_str(), data.size());
}